

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int JS_SetModuleExportList(JSContext *ctx,JSModuleDef *m,JSCFunctionListEntry *tab,int len)

{
  char *__s;
  ulong uVar1;
  int iVar2;
  size_t buf_len;
  JSValueUnion JVar3;
  long lVar4;
  bool bVar5;
  JSValue obj;
  
  if (0 < len) {
    lVar4 = 0;
    do {
      switch((&tab->def_type)[lVar4]) {
      case '\0':
        obj = JS_NewCFunction3(ctx,*(JSCFunction **)((long)&tab->u + lVar4 + 8),
                               *(char **)((long)&tab->name + lVar4),
                               (uint)*(byte *)((long)&tab->u + lVar4),
                               (uint)*(byte *)((long)&tab->u + lVar4 + 1),
                               (int)*(short *)((long)&tab->magic + lVar4),ctx->function_proto);
        break;
      default:
        abort();
      case '\x03':
        __s = *(char **)((long)&tab->u + lVar4);
        buf_len = strlen(__s);
        obj = JS_NewStringLen(ctx,__s,buf_len);
        break;
      case '\x04':
        obj = (JSValue)ZEXT416(*(uint *)((long)&tab->u + lVar4));
        break;
      case '\x05':
        uVar1 = *(ulong *)((long)&tab->u + lVar4);
        bVar5 = (long)(int)uVar1 == uVar1;
        JVar3.float64 = (double)(long)uVar1;
        if (bVar5) {
          JVar3.ptr = (void *)(uVar1 & 0xffffffff);
        }
        obj.tag = 7;
        obj.u.float64 = JVar3.float64;
        if (bVar5) {
          obj.tag = 0;
        }
        break;
      case '\x06':
        obj.tag = 7;
        obj.u.ptr = ((JSValueUnion *)((long)&tab->u + lVar4))->ptr;
        break;
      case '\b':
        obj = JS_NewObjectProtoClass(ctx,ctx->class_proto[1],1);
        JS_SetPropertyFunctionList
                  (ctx,obj,*(JSCFunctionListEntry **)((long)&tab->u + lVar4),
                   *(int *)((long)&tab->u + lVar4 + 8));
      }
      iVar2 = JS_SetModuleExport(ctx,m,*(char **)((long)&tab->name + lVar4),obj);
      if (iVar2 != 0) {
        return -1;
      }
      lVar4 = lVar4 + 0x20;
    } while ((ulong)(uint)len << 5 != lVar4);
  }
  return 0;
}

Assistant:

int JS_SetModuleExportList(JSContext *ctx, JSModuleDef *m,
                           const JSCFunctionListEntry *tab, int len)
{
    int i;
    JSValue val;

    for(i = 0; i < len; i++) {
        const JSCFunctionListEntry *e = &tab[i];
        switch(e->def_type) {
        case JS_DEF_CFUNC:
            val = JS_NewCFunction2(ctx, e->u.func.cfunc.generic,
                                   e->name, e->u.func.length, e->u.func.cproto, e->magic);
            break;
        case JS_DEF_PROP_STRING:
            val = JS_NewString(ctx, e->u.str);
            break;
        case JS_DEF_PROP_INT32:
            val = JS_NewInt32(ctx, e->u.i32);
            break;
        case JS_DEF_PROP_INT64:
            val = JS_NewInt64(ctx, e->u.i64);
            break;
        case JS_DEF_PROP_DOUBLE:
            val = __JS_NewFloat64(ctx, e->u.f64);
            break;
        case JS_DEF_OBJECT:
            val = JS_NewObject(ctx);
            JS_SetPropertyFunctionList(ctx, val, e->u.prop_list.tab, e->u.prop_list.len);
            break;
        default:
            abort();
        }
        if (JS_SetModuleExport(ctx, m, e->name, val))
            return -1;
    }
    return 0;
}